

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  byte bVar5;
  undefined1 uVar6;
  byte *pbVar7;
  bool bVar8;
  int tok;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if (ptr == end) {
    return -1;
  }
  bVar2 = *ptr;
  if (bVar2 < 0xdc) {
    bVar5 = 7;
    if (bVar2 - 0xd8 < 4) goto LAB_0015f97b;
    if (bVar2 == 0) {
      bVar5 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      goto LAB_0015f97b;
    }
  }
  else {
    if (bVar2 - 0xdc < 4) {
      bVar5 = 8;
      goto LAB_0015f97b;
    }
    if ((bVar2 == 0xff) && (0xfd < (byte)ptr[1])) {
      bVar5 = 0;
      goto LAB_0015f97b;
    }
  }
  bVar5 = 0x1d;
LAB_0015f97b:
  if (bVar5 < 0x16) {
    if (bVar5 == 5) {
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
    }
    else if (bVar5 == 6) {
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
    }
    else if ((bVar5 == 7) && ((long)end - (long)ptr < 4)) {
      return -2;
    }
  }
  else if (((bVar5 == 0x16) || (bVar5 == 0x18)) ||
          ((bVar5 == 0x1d &&
           ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[1] >> 3 & 0x1c |
                             (uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] << 5)) >> ((byte)ptr[1] & 0x1f)
            & 1) != 0)))) {
    if (ptr + 2 == end) {
      return -1;
    }
    lVar4 = (long)end - (long)ptr;
    pbVar7 = (byte *)(ptr + 4);
LAB_0015fa27:
    lVar4 = lVar4 + -2;
    bVar2 = pbVar7[-2];
    if (bVar2 < 0xdc) {
      uVar6 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)pbVar7[-1]);
        }
        else {
LAB_0015fa80:
          uVar6 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      uVar6 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (pbVar7[-1] < 0xfe)) goto LAB_0015fa80;
      uVar6 = 0;
    }
    switch(uVar6) {
    case 5:
      if (lVar4 < 2) {
        return -2;
      }
      break;
    case 6:
      if (lVar4 < 3) {
        return -2;
      }
      break;
    case 7:
      if (lVar4 < 4) {
        return -2;
      }
      break;
    case 9:
    case 10:
    case 0x15:
      iVar3 = big2_checkPiTarget((ENCODING *)ptr,(char *)(pbVar7 + -2),(char *)&local_34,
                                 (int *)&switchD_0015fa9c::switchdataD_001ddb94);
      pbVar1 = pbVar7;
      if (iVar3 == 0) {
        *nextTokPtr = (char *)(pbVar7 + -2);
        return 0;
      }
      goto joined_r0x0015fb33;
    case 0xf:
      iVar3 = big2_checkPiTarget((ENCODING *)ptr,(char *)(pbVar7 + -2),(char *)&local_34,
                                 (int *)&switchD_0015fa9c::switchdataD_001ddb94);
      if (iVar3 == 0) {
        *nextTokPtr = (char *)(pbVar7 + -2);
        return 0;
      }
      if (pbVar7 == (byte *)end) {
        return -1;
      }
      if ((*pbVar7 != 0) || (pbVar7[1] != 0x3e)) goto switchD_0015fb9c_caseD_0;
      pbVar7 = pbVar7 + 2;
      goto LAB_0015fca0;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_0015fa9c_caseD_16;
    case 0x1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(pbVar7[-1] >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5)) >> (pbVar7[-1] & 0x1f)
          & 1) != 0) goto switchD_0015fa9c_caseD_16;
    }
    pbVar7 = pbVar7 + -2;
    goto switchD_0015fb9c_caseD_0;
  }
  *nextTokPtr = ptr;
  return 0;
switchD_0015fa9c_caseD_16:
  bVar8 = pbVar7 == (byte *)end;
  pbVar7 = pbVar7 + 2;
  if (bVar8) {
    return -1;
  }
  goto LAB_0015fa27;
joined_r0x0015fb33:
  pbVar7 = pbVar1;
  if (pbVar7 == (byte *)end) {
    return -1;
  }
  bVar2 = *pbVar7;
  if (bVar2 < 0xdc) {
    uVar6 = 7;
    if (3 < bVar2 - 0xd8) {
      if (bVar2 == 0) {
        uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)pbVar7[1]);
      }
      else {
LAB_0015fb8b:
        uVar6 = 0x1d;
      }
    }
  }
  else if (bVar2 - 0xdc < 4) {
    uVar6 = 8;
  }
  else {
    if ((bVar2 != 0xff) || (pbVar7[1] < 0xfe)) goto LAB_0015fb8b;
    uVar6 = 0;
  }
  switch(uVar6) {
  case 0:
  case 1:
  case 8:
switchD_0015fb9c_caseD_0:
    *nextTokPtr = (char *)pbVar7;
    return 0;
  case 5:
    if ((long)end - (long)pbVar7 < 2) {
      return -2;
    }
  default:
    pbVar1 = pbVar7 + 2;
    break;
  case 6:
    if ((long)end - (long)pbVar7 < 3) {
      return -2;
    }
    pbVar1 = pbVar7 + 3;
    break;
  case 7:
    if ((long)end - (long)pbVar7 < 4) {
      return -2;
    }
    pbVar1 = pbVar7 + 4;
    break;
  case 0xf:
    pbVar1 = pbVar7 + 2;
    if (pbVar1 == (byte *)end) {
      return -1;
    }
    if ((*pbVar1 == 0) && (pbVar7[3] == 0x3e)) {
      pbVar7 = pbVar7 + 4;
LAB_0015fca0:
      *nextTokPtr = (char *)pbVar7;
      return local_34;
    }
  }
  goto joined_r0x0015fb33;
}

Assistant:

static
int PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (ptr != end) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}